

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O0

int henson_queue_empty(char *name)

{
  bool bVar1;
  char *in_RDI;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  NameMap *this;
  allocator local_31;
  string local_30 [44];
  uint local_4;
  
  if (namemap == (NameMap *)0x0) {
    local_4 = 1;
  }
  else {
    this = namemap;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,in_RDI,&local_31);
    bVar1 = henson::NameMap::queue_empty
                      (this,(string *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98))
    ;
    local_4 = (uint)bVar1;
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return local_4;
}

Assistant:

int
henson_queue_empty(const char* name)
{
    if (!namemap) return 1;
    return namemap->queue_empty(name);
}